

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall
MacProj::mac_sync_compute
          (MacProj *this,int level,Array<MultiFab_*,_3> *Ucorr,MultiFab *u_mac,MultiFab *Vsync,
          MultiFab *Ssync,FluxRegister *adv_flux_reg,
          Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *advectionType,Real prev_time,
          Real dt,int num_state_comps,Real be_cn_theta,int do_mom_diff,bool update_fluxreg)

{
  BoxArray *bxs;
  Geometry *geom;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AmrLevel *pAVar8;
  pointer pGVar9;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> this_00;
  MultiFab *pMVar10;
  MultiFab *pMVar11;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var12;
  FArrayBox *pFVar13;
  double *pdVar14;
  double *pdVar15;
  MultiFab *ucorr;
  MultiFab *vcorr;
  MultiFab *wcorr;
  string redistribution_type;
  string redistribution_type_00;
  uint aofs_comp;
  MultiFab *aofs;
  bool bVar16;
  bool bVar17;
  int j_3;
  int iVar18;
  BoxArray *pBVar19;
  DeviceVector<amrex::BCRec> *pDVar20;
  MultiFab *pMVar21;
  int *piVar22;
  int *piVar23;
  MultiFab *yfluxes;
  uint uVar24;
  ulong uVar25;
  int *piVar26;
  long lVar27;
  MultiFab *wmac;
  long lVar28;
  long lVar29;
  MultiFab *vmac;
  int d;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int comp;
  long lVar40;
  long lVar41;
  long lVar42;
  DistributionMapping *dm;
  long lVar43;
  int j_2;
  uint scomp;
  MultiFab *pMVar44;
  long lVar45;
  ulong uVar46;
  MultiFab *state;
  long lVar47;
  double dVar48;
  Real mult;
  undefined1 uVar49;
  undefined7 uVar50;
  undefined8 in_stack_ffffffffffffec08;
  undefined4 uVar52;
  pointer pBVar51;
  Box gbx;
  Vector<int,_std::allocator<int>_> iconserv_h;
  int local_1318;
  int local_1314;
  int local_1310;
  MFIter Smfi;
  string local_1230 [32];
  string local_1210 [32];
  FillPatchIterator S_fpi;
  allocator_type local_fe0 [24];
  MultiFab forcing_term;
  MultiFab momenta;
  MultiFab visc_terms;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bcs;
  MultiFab local_ac0;
  MultiFab local_938 [6];
  
  pAVar8 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
           super__Vector_impl_data._M_start[level];
  pGVar9 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[level]._M_t;
  bxs = &pAVar8->grids;
  lVar30 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar30));
    lVar30 = lVar30 + 0x180;
  } while (lVar30 != 0x480);
  dm = &pAVar8->dmap;
  lVar30 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar30));
    lVar30 = lVar30 + 0x180;
  } while (lVar30 != 0x480);
  geom = pGVar9 + level;
  pMVar21 = local_938 + 3;
  pMVar44 = local_938;
  for (lVar30 = 0; lVar30 != 3; lVar30 = lVar30 + 1) {
    pBVar19 = amrex::AmrLevel::getEdgeBoxArray
                        ((this->LevelData).
                         super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                         super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[level],(int)lVar30);
    S_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    S_fpi.super_MFIter.tile_size.vect[2] = 0;
    S_fpi.super_MFIter.flags = '\0';
    S_fpi.super_MFIter._29_3_ = 0;
    S_fpi.super_MFIter.currentIndex = 0;
    S_fpi.super_MFIter.beginIndex = 0;
    S_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
    S_fpi.super_MFIter.tile_size.vect[0] = 0;
    S_fpi.super_MFIter.tile_size.vect[1] = 0;
    (*(pMVar44->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar44,pBVar19,dm,(ulong)(uint)num_state_comps,0,&S_fpi,
               (int)(FabFactory<amrex::FArrayBox> *)
                    ((AmrLevel *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
                    _vptr_AmrLevel);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&S_fpi.super_MFIter.tile_size);
    S_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    S_fpi.super_MFIter.tile_size.vect[2] = 0;
    S_fpi.super_MFIter.flags = '\0';
    S_fpi.super_MFIter._29_3_ = 0;
    S_fpi.super_MFIter.currentIndex = 0;
    S_fpi.super_MFIter.beginIndex = 0;
    S_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
    S_fpi.super_MFIter.tile_size.vect[0] = 0;
    S_fpi.super_MFIter.tile_size.vect[1] = 0;
    (*(pMVar21->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar21,pBVar19,dm,1,0,&S_fpi,
               (int)(FabFactory<amrex::FArrayBox> *)
                    ((AmrLevel *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
                    _vptr_AmrLevel);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&S_fpi.super_MFIter.tile_size);
    pMVar21 = pMVar21 + 1;
    pMVar44 = pMVar44 + 1;
  }
  iVar18 = NavierStokesBase::nghost_force
                     ((NavierStokesBase *)
                      this_00._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
  S_fpi.super_MFIter.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  S_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
  S_fpi.super_MFIter.tile_size.vect[0] = 0;
  S_fpi.super_MFIter.tile_size.vect[1] = 0;
  S_fpi.super_MFIter.tile_size.vect[2] = 0;
  S_fpi.super_MFIter.flags = '\0';
  S_fpi.super_MFIter._29_3_ = 0;
  S_fpi.super_MFIter.currentIndex = 0;
  S_fpi.super_MFIter.beginIndex = 0;
  amrex::MultiFab::MultiFab
            (&visc_terms,bxs,dm,num_state_comps,iVar18,(MFInfo *)&S_fpi,
             (FabFactory<amrex::FArrayBox> *)
             ((AmrLevel *)
             ((long)this_00._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
             _vptr_AmrLevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&S_fpi.super_MFIter.tile_size);
  iVar18 = NavierStokesBase::nghost_state
                     ((NavierStokesBase *)
                      this_00._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
  amrex::FillPatchIterator::FillPatchIterator
            (&S_fpi,(AmrLevel *)
                    this_00._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&visc_terms,iVar18
             ,prev_time,0,0,num_state_comps);
  bVar16 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"MOL");
  uVar52 = (undefined4)((ulong)pMVar21 >> 0x20);
  if (bVar16) {
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              (&math_bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,1,
               (allocator_type *)&momenta);
    scomp = 0;
    uVar24 = 0;
    if (0 < num_state_comps) {
      uVar24 = num_state_comps;
    }
    while( true ) {
      if (uVar24 == scomp) break;
      NavierStokesBase::fetchBCArray
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&momenta,
                 (NavierStokesBase *)
                 this_00._M_t.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,scomp,1);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::_M_move_assign
                (&math_bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,&momenta);
      std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&momenta);
      pDVar20 = (DeviceVector<amrex::BCRec> *)
                ((long)this_00._M_t.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbe0);
      pMVar21 = Ssync;
      aofs_comp = scomp - 3;
      if (scomp < 3) {
        pDVar20 = (DeviceVector<amrex::BCRec> *)
                  ((long)this_00._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbc8);
        pMVar21 = Vsync;
        aofs_comp = scomp;
      }
      pBVar51 = pDVar20->m_data;
      bVar16 = amrex::EBFArrayBoxFactory::isAllRegular
                         ((EBFArrayBoxFactory *)
                          ((AmrLevel *)
                          ((long)this_00._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0x218))->_vptr_AmrLevel);
      pMVar44 = Ucorr->_M_elems[0];
      pMVar10 = Ucorr->_M_elems[1];
      pMVar11 = Ucorr->_M_elems[2];
      if (bVar16) {
        MOL::ComputeSyncAofs
                  (pMVar21,aofs_comp,1,&S_fpi.m_fabs,scomp,u_mac,u_mac + 1,u_mac + 2,pMVar44,pMVar10
                   ,pMVar11,local_938 + 3,local_938 + 4,local_938 + 5,0,false,local_938,
                   local_938 + 1,local_938 + 2,scomp,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   &math_bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                   pBVar51 + (int)aofs_comp,geom,scomp < 3);
      }
      else {
        uVar49 = 0x1f;
        uVar50 = 0x3553;
        std::__cxx11::string::string
                  (local_1230,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
        redistribution_type._M_string_length._0_1_ = uVar49;
        redistribution_type._M_dataplus._M_p = (pointer)local_1230;
        redistribution_type._M_string_length._1_7_ = uVar50;
        redistribution_type.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
        redistribution_type.field_2._8_4_ = uVar24;
        redistribution_type.field_2._12_4_ = uVar52;
        EBMOL::ComputeSyncAofs
                  (pMVar21,aofs_comp,1,&S_fpi.m_fabs,scomp,u_mac,u_mac + 1,u_mac + 2,pMVar44,pMVar10
                   ,pMVar11,local_938 + 3,local_938 + 4,local_938 + 5,0,false,local_938,
                   local_938 + 1,local_938 + 2,scomp,&math_bcs,pBVar51 + (int)aofs_comp,geom,dt,
                   scomp < 3,redistribution_type);
        std::__cxx11::string::~string(local_1230);
      }
      scomp = scomp + 1;
    }
    std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
              ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&math_bcs);
  }
  else {
    bVar16 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"Godunov_PLM");
    if (((bVar16) ||
        (bVar16 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"Godunov_PPM"),
        bVar16)) ||
       (bVar16 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"BDS"), bVar16)) {
      iVar18 = NavierStokesBase::nghost_force
                         ((NavierStokesBase *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      pMVar21 = NavierStokesBase::getDivCond
                          ((NavierStokesBase *)
                           this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,iVar18,
                           prev_time);
      _Var12.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           ((pointer)
           ((AmrLevel *)
           ((long)this_00._M_t.
                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170))->
           _vptr_AmrLevel)[2].old_data._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&visc_terms.super_FabArray<amrex::FArrayBox>,0.0);
      if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
        (*(*(_func_int ***)
            this_00._M_t.
            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl)[0x33])
                  (prev_time,
                   this_00._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&visc_terms,0,
                   (ulong)(uint)num_state_comps);
      }
      iVar18 = NavierStokesBase::nghost_state
                         ((NavierStokesBase *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      amrex::FillPatchIterator::FillPatchIterator
                ((FillPatchIterator *)&math_bcs,
                 (AmrLevel *)
                 this_00._M_t.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&visc_terms,iVar18,
                 prev_time,0,3,1);
      amrex::MultiFab::MultiFab(&momenta);
      if (do_mom_diff == 1) {
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)0x1;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ =
             0;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_
             = 0;
        forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_
             = 0;
        amrex::MultiFab::define
                  (&momenta,bxs,dm,3,
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0],
                   (MFInfo *)&forcing_term,
                   (FabFactory<amrex::FArrayBox> *)
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&forcing_term.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                      m_bat.m_op.m_bndryReg.m_typ);
        amrex::MultiFab::Copy
                  (&momenta,&S_fpi.m_fabs,0,0,3,
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0]);
        for (iVar18 = 0; iVar18 != 3; iVar18 = iVar18 + 1) {
          amrex::MultiFab::Multiply
                    (&momenta,&local_ac0,0,iVar18,1,
                     S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0]
                    );
        }
      }
      iVar18 = NavierStokesBase::nghost_force
                         ((NavierStokesBase *)
                          this_00._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      Smfi.fabArray = (FabArrayBase *)0x0;
      Smfi.tile_size.vect[0] = 0;
      Smfi.tile_size.vect[1] = 0;
      Smfi.tile_size.vect[2] = 0;
      Smfi.flags = '\0';
      Smfi._29_3_ = 0;
      Smfi.currentIndex = 0;
      Smfi.beginIndex = 0;
      iconserv_h.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)&PTR__FabFactory_007d2928;
      amrex::MultiFab::MultiFab
                (&forcing_term,bxs,dm,num_state_comps,iVar18,(MFInfo *)&Smfi,
                 (FabFactory<amrex::FArrayBox> *)&iconserv_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&Smfi.tile_size);
      amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)&S_fpi.m_fabs,true);
      uVar25 = 0;
      if (0 < num_state_comps) {
        uVar25 = (ulong)(uint)num_state_comps;
      }
      while( true ) {
        piVar23 = &Smfi.currentIndex;
        if (Smfi.endIndex <= Smfi.currentIndex) break;
        iVar18 = NavierStokesBase::nghost_force
                           ((NavierStokesBase *)
                            this_00._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
        amrex::MFIter::growntilebox(&gbx,&Smfi,iVar18);
        if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar23 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + Smfi.currentIndex;
        }
        iVar18 = *piVar23;
        (*(*(_func_int ***)
            this_00._M_t.
            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl)[0x2a])
                  (prev_time,
                   this_00._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   forcing_term.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar18],&gbx,0,
                   (ulong)(uint)num_state_comps,
                   S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar18],
                   local_ac0.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar18],0,(int)&Smfi);
        lVar30 = 0;
        uVar46 = 0;
        while( true ) {
          piVar23 = &Smfi.currentIndex;
          if (uVar46 == uVar25) break;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&iconserv_h,&forcing_term.super_FabArray<amrex::FArrayBox>,
                     &Smfi,(int)uVar46);
          if (uVar46 < 3) {
            piVar22 = piVar23;
            piVar26 = piVar23;
            if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar26 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + Smfi.currentIndex;
              piVar22 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + Smfi.currentIndex;
            }
            pFVar13 = visc_terms.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar26];
            iVar18 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[0];
            iVar1 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[1];
            iVar2 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[2];
            pdVar14 = (pFVar13->super_BaseFab<double>).dptr;
            lVar27 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[0] - iVar18) + 1);
            lVar40 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
            lVar28 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
            lVar31 = *(long *)(*(long *)((long)_Var12.
                                               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                               .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                               _M_head_impl + 0x108) + (long)*piVar22 * 8);
            iVar3 = *(int *)(lVar31 + 0x18);
            iVar4 = *(int *)(lVar31 + 0x1c);
            iVar5 = *(int *)(lVar31 + 0x20);
            lVar33 = (long)((*(int *)(lVar31 + 0x24) - iVar3) + 1);
            lVar29 = (long)((*(int *)(lVar31 + 0x28) - iVar4) + 1);
            lVar32 = (long)((*(int *)(lVar31 + 0x2c) - iVar5) + 1);
            if (do_mom_diff == 0) {
              if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar23 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + Smfi.currentIndex;
              }
              pFVar13 = local_ac0.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                        super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[*piVar23];
              iVar6 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[1];
              lVar36 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1);
              lVar47 = (long)gbx.smallend.vect[1];
              lVar45 = (long)gbx.smallend.vect[2];
              iVar7 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[0];
              lVar38 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[0] - iVar7) + 1);
              lVar37 = (long)gbx.smallend.vect[0];
              lVar34 = (lVar47 * 8 +
                        (lVar45 - (pFVar13->super_BaseFab<double>).domain.smallend.vect[2]) * lVar36
                        * 8 + (long)iVar6 * -8) * lVar38 + lVar37 * 8 + (long)iVar7 * -8 +
                       (long)(pFVar13->super_BaseFab<double>).dptr;
              lVar31 = *(long *)(lVar31 + 0x10) +
                       ((lVar32 * lVar30 + lVar45 * 8 + (long)iVar5 * -8) * lVar29 + lVar47 * 8 +
                       (long)iVar4 * -8) * lVar33 + lVar37 * 8 + (long)iVar3 * -8;
              lVar32 = (long)pdVar14 +
                       ((lVar28 * lVar30 + lVar45 * 8 + (long)iVar2 * -8) * lVar40 + lVar47 * 8 +
                       (long)iVar1 * -8) * lVar27 + lVar37 * 8 + (long)iVar18 * -8;
              lVar28 = (lVar47 - local_1314) *
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish * 8 +
                       (lVar45 - local_1310) *
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage * 8 + lVar37 * 8 +
                       (long)local_1318 * -8 +
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              for (; lVar37 = lVar32, lVar41 = lVar31, lVar35 = lVar47, lVar39 = lVar28,
                  lVar43 = lVar34, lVar45 <= gbx.bigend.vect[2]; lVar45 = lVar45 + 1) {
                for (; lVar35 <= gbx.bigend.vect[1]; lVar35 = lVar35 + 1) {
                  if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                    lVar42 = 0;
                    do {
                      dVar48 = (*(double *)(lVar37 + lVar42 * 8) - *(double *)(lVar41 + lVar42 * 8))
                               + *(double *)(lVar39 + lVar42 * 8);
                      *(double *)(lVar39 + lVar42 * 8) = dVar48;
                      *(double *)(lVar39 + lVar42 * 8) = dVar48 / *(double *)(lVar43 + lVar42 * 8);
                      lVar42 = lVar42 + 1;
                    } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar42);
                  }
                  lVar37 = lVar37 + lVar27 * 8;
                  lVar41 = lVar41 + lVar33 * 8;
                  lVar39 = lVar39 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish * 8;
                  lVar43 = lVar43 + lVar38 * 8;
                }
                lVar34 = lVar34 + lVar36 * lVar38 * 8;
                lVar28 = lVar28 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage * 8;
                lVar31 = lVar31 + lVar29 * lVar33 * 8;
                lVar32 = lVar32 + lVar40 * lVar27 * 8;
              }
            }
            else {
              lVar34 = (long)gbx.smallend.vect[1];
              lVar45 = (long)gbx.smallend.vect[2];
              lVar38 = (long)gbx.smallend.vect[0];
              lVar32 = *(long *)(lVar31 + 0x10) +
                       ((lVar45 * 8 + lVar32 * lVar30 + (long)iVar5 * -8) * lVar29 + lVar34 * 8 +
                       (long)iVar4 * -8) * lVar33 + lVar38 * 8 + (long)iVar3 * -8;
              lVar28 = (long)pdVar14 +
                       ((lVar28 * lVar30 + lVar45 * 8 + (long)iVar2 * -8) * lVar40 + lVar34 * 8 +
                       (long)iVar1 * -8) * lVar27 + lVar38 * 8 + (long)iVar18 * -8;
              lVar31 = (lVar34 - local_1314) *
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish * 8 +
                       (lVar45 - local_1310) *
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage * 8 + lVar38 * 8 +
                       (long)local_1318 * -8 +
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              for (; lVar38 = lVar34, lVar36 = lVar28, lVar37 = lVar32, lVar47 = lVar31,
                  lVar45 <= gbx.bigend.vect[2]; lVar45 = lVar45 + 1) {
                for (; lVar38 <= gbx.bigend.vect[1]; lVar38 = lVar38 + 1) {
                  if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                    lVar41 = 0;
                    do {
                      *(double *)(lVar47 + lVar41 * 8) =
                           (*(double *)(lVar36 + lVar41 * 8) - *(double *)(lVar37 + lVar41 * 8)) +
                           *(double *)(lVar47 + lVar41 * 8);
                      lVar41 = lVar41 + 1;
                    } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar41);
                  }
                  lVar36 = lVar36 + lVar27 * 8;
                  lVar37 = lVar37 + lVar33 * 8;
                  lVar47 = lVar47 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish * 8;
                }
                lVar31 = lVar31 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage * 8;
                lVar32 = lVar32 + lVar29 * lVar33 * 8;
                lVar28 = lVar28 + lVar40 * lVar27 * 8;
              }
            }
          }
          else {
            piVar26 = piVar23;
            if (Smfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar26 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + Smfi.currentIndex;
              piVar23 = ((Smfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + Smfi.currentIndex;
            }
            pFVar13 = visc_terms.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar26];
            iVar18 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[0];
            lVar28 = (long)iVar18;
            iVar1 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[1];
            lVar38 = (long)iVar1;
            iVar2 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[2];
            lVar33 = (long)iVar2;
            pdVar14 = (pFVar13->super_BaseFab<double>).dptr;
            lVar31 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[0] - iVar18) + 1);
            lVar29 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
            lVar40 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
            pFVar13 = local_ac0.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar23];
            pdVar15 = (pFVar13->super_BaseFab<double>).dptr;
            iVar18 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[0];
            iVar1 = (pFVar13->super_BaseFab<double>).domain.smallend.vect[1];
            lVar27 = (long)(pFVar13->super_BaseFab<double>).domain.smallend.vect[2];
            lVar32 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[0] - iVar18) + 1);
            lVar34 = (long)(((pFVar13->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
            if ((NavierStokesBase::do_temp == 0) || (uVar46 != (uint)NavierStokesBase::Temp)) {
              lVar37 = (long)gbx.smallend.vect[0];
              lVar45 = (long)gbx.smallend.vect[1];
              lVar36 = (long)gbx.smallend.vect[2];
              if ((advectionType->super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>).
                  super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar46] == Conservative) {
                lVar27 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start +
                         (lVar45 - local_1314) *
                         (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish * 8 +
                         (lVar36 - local_1310) *
                         (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage * 8 + lVar37 * 8 +
                         (long)local_1318 * -8;
                lVar28 = (long)pdVar14 +
                         ((lVar40 * lVar30 + lVar36 * 8 + lVar33 * -8) * lVar29 + lVar45 * 8 +
                         lVar38 * -8) * lVar31 + lVar37 * 8 + lVar28 * -8;
                for (; lVar32 = lVar28, lVar33 = lVar27, lVar40 = lVar45,
                    lVar36 <= gbx.bigend.vect[2]; lVar36 = lVar36 + 1) {
                  for (; lVar40 <= gbx.bigend.vect[1]; lVar40 = lVar40 + 1) {
                    if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                      lVar34 = 0;
                      do {
                        *(double *)(lVar33 + lVar34 * 8) =
                             *(double *)(lVar32 + lVar34 * 8) + *(double *)(lVar33 + lVar34 * 8);
                        lVar34 = lVar34 + 1;
                      } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar34);
                    }
                    lVar32 = lVar32 + lVar31 * 8;
                    lVar33 = lVar33 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish * 8;
                  }
                  lVar27 = lVar27 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage * 8;
                  lVar28 = lVar28 + lVar29 * lVar31 * 8;
                }
              }
              else {
                lVar33 = (long)pdVar14 +
                         ((lVar40 * lVar30 + lVar36 * 8 + lVar33 * -8) * lVar29 + lVar45 * 8 +
                         lVar38 * -8) * lVar31 + lVar37 * 8 + lVar28 * -8;
                lVar27 = (long)pdVar15 +
                         ((lVar36 - lVar27) * lVar34 * 8 + lVar45 * 8 + (long)iVar1 * -8) * lVar32 +
                         lVar37 * 8 + (long)iVar18 * -8;
                lVar28 = (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start +
                         (lVar45 - local_1314) *
                         (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish * 8 +
                         (lVar36 - local_1310) *
                         (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage * 8 + lVar37 * 8 +
                         (long)local_1318 * -8;
                for (; lVar40 = lVar45, lVar38 = lVar27, lVar37 = lVar28, lVar47 = lVar33,
                    lVar36 <= gbx.bigend.vect[2]; lVar36 = lVar36 + 1) {
                  for (; lVar40 <= gbx.bigend.vect[1]; lVar40 = lVar40 + 1) {
                    if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                      lVar41 = 0;
                      do {
                        *(double *)(lVar37 + lVar41 * 8) =
                             *(double *)(lVar37 + lVar41 * 8) / *(double *)(lVar38 + lVar41 * 8) +
                             *(double *)(lVar47 + lVar41 * 8);
                        lVar41 = lVar41 + 1;
                      } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar41);
                    }
                    lVar38 = lVar38 + lVar32 * 8;
                    lVar37 = lVar37 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish * 8;
                    lVar47 = lVar47 + lVar31 * 8;
                  }
                  lVar33 = lVar33 + lVar29 * lVar31 * 8;
                  lVar27 = lVar27 + lVar34 * lVar32 * 8;
                  lVar28 = lVar28 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage * 8;
                }
              }
            }
            else {
              lVar36 = (long)gbx.smallend.vect[1];
              lVar37 = (long)gbx.smallend.vect[2];
              lVar45 = (long)gbx.smallend.vect[0];
              lVar27 = (long)pdVar15 +
                       (lVar36 * 8 + (lVar37 - lVar27) * lVar34 * 8 + (long)iVar1 * -8) * lVar32 +
                       lVar45 * 8 + (long)iVar18 * -8;
              lVar33 = (long)pdVar14 +
                       ((lVar40 * lVar30 + lVar37 * 8 + lVar33 * -8) * lVar29 + lVar36 * 8 +
                       lVar38 * -8) * lVar31 + lVar45 * 8 + lVar28 * -8;
              lVar28 = (lVar36 - local_1314) *
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish * 8 +
                       (lVar37 - local_1310) *
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage * 8 + lVar45 * 8 +
                       (long)local_1318 * -8 +
                       (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              for (; lVar40 = lVar33, lVar38 = lVar27, lVar45 = lVar28, lVar47 = lVar36,
                  lVar37 <= gbx.bigend.vect[2]; lVar37 = lVar37 + 1) {
                for (; lVar47 <= gbx.bigend.vect[1]; lVar47 = lVar47 + 1) {
                  if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
                    lVar41 = 0;
                    do {
                      *(double *)(lVar45 + lVar41 * 8) =
                           (*(double *)(lVar45 + lVar41 * 8) + *(double *)(lVar40 + lVar41 * 8)) /
                           *(double *)(lVar38 + lVar41 * 8);
                      lVar41 = lVar41 + 1;
                    } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar41);
                  }
                  lVar40 = lVar40 + lVar31 * 8;
                  lVar38 = lVar38 + lVar32 * 8;
                  lVar45 = lVar45 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish * 8;
                }
                lVar27 = lVar27 + lVar34 * lVar32 * 8;
                lVar33 = lVar33 + lVar29 * lVar31 * 8;
                lVar28 = lVar28 + (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage * 8;
              }
            }
          }
          uVar46 = uVar46 + 1;
          lVar30 = lVar30 + 8;
        }
        amrex::MFIter::operator++(&Smfi);
      }
      amrex::MFIter::~MFIter(&Smfi);
      pMVar44 = local_938 + 2;
      yfluxes = local_938 + 1;
      pMVar10 = local_938 + 5;
      pMVar11 = local_938 + 4;
      wmac = u_mac + 2;
      vmac = u_mac + 1;
      lVar30 = -0x48;
      for (uVar46 = 0; uVar25 != uVar46; uVar46 = uVar46 + 1) {
        iVar18 = (int)uVar46;
        if (uVar46 < 3) {
          pBVar51 = ((DeviceVector<amrex::BCRec> *)
                    ((long)this_00._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xbc8))->
                    m_data + uVar46;
          iVar1 = iVar18;
          aofs = Vsync;
        }
        else {
          pBVar51 = (pointer)((long)((DeviceVector<amrex::BCRec> *)
                                    ((long)this_00._M_t.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                           _M_head_impl + 0xbe0))->m_data->bc + lVar30);
          iVar1 = iVar18 + -3;
          aofs = Ssync;
        }
        state = &S_fpi.m_fabs;
        if (uVar46 < 3) {
          state = &momenta;
        }
        if (do_mom_diff != 1) {
          state = &S_fpi.m_fabs;
        }
        Smfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
        Smfi.fabArray = (FabArrayBase *)0x0;
        Smfi.tile_size.vect[0] = 0;
        Smfi.tile_size.vect[1] = 0;
        iconserv_h.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        iconserv_h.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        iconserv_h.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        amrex::PODVector<int,_std::allocator<int>_>::resize
                  ((PODVector<int,_std::allocator<int>_> *)&Smfi,1);
        gbx.smallend.vect[0] = 0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&iconserv_h.super_vector<int,_std::allocator<int>_>,1,(value_type_conflict *)&gbx
                  );
        *iconserv_h.super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (uint)((advectionType->super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>).
                    super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar46] == Conservative);
        if ((long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start != 0) {
          memcpy((void *)Smfi.m_fa._M_t.
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                 iconserv_h.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,(long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        bVar16 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"Godunov_PPM");
        bVar17 = amrex::EBFArrayBoxFactory::isAllRegular
                           ((EBFArrayBoxFactory *)
                            ((AmrLevel *)
                            ((long)this_00._M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                   .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                            0x218))->_vptr_AmrLevel);
        if (bVar17) {
          bVar17 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"BDS");
          if ((uVar46 < 3) || (!bVar17)) {
            Godunov::ComputeSyncAofs
                      (aofs,iVar1,1,state,iVar18,u_mac,vmac,wmac,Ucorr->_M_elems[0],
                       Ucorr->_M_elems[1],Ucorr->_M_elems[2],local_938 + 3,pMVar11,pMVar10,0,false,
                       local_938,yfluxes,pMVar44,iVar18,&forcing_term,iVar18,pMVar21,pBVar51,geom,
                       (DeviceVector<int> *)&Smfi,dt,bVar16,
                       NavierStokesBase::godunov_use_forces_in_trans,uVar46 < 3);
          }
          else {
            BDS::ComputeSyncAofs
                      (Ssync,iVar18 + -3,1,state,iVar18,u_mac,vmac,wmac,Ucorr->_M_elems[0],
                       Ucorr->_M_elems[1],Ucorr->_M_elems[2],local_938 + 3,pMVar11,pMVar10,0,false,
                       local_938,yfluxes,pMVar44,iVar18,&forcing_term,iVar18,pMVar21,pBVar51,geom,
                       (DeviceVector<int> *)&Smfi,dt,false);
          }
        }
        else {
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&gbx,1,local_fe0);
          NavierStokesBase::fetchBCArray
                    ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_fe0,
                     (NavierStokesBase *)
                     this_00._M_t.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,iVar18,1);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::_M_move_assign
                    ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&gbx,local_fe0);
          std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                    ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_fe0);
          ucorr = Ucorr->_M_elems[0];
          vcorr = Ucorr->_M_elems[1];
          wcorr = Ucorr->_M_elems[2];
          uVar49 = 0x8f;
          uVar50 = 0x3565;
          std::__cxx11::string::string
                    (local_1210,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
          redistribution_type_00._M_string_length._0_1_ = uVar49;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_1210;
          redistribution_type_00._M_string_length._1_7_ = uVar50;
          redistribution_type_00.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
          redistribution_type_00.field_2._8_4_ = (int)pBVar51;
          redistribution_type_00.field_2._12_4_ = (int)((ulong)pBVar51 >> 0x20);
          EBGodunov::ComputeSyncAofs
                    (aofs,iVar1,1,state,iVar18,u_mac,vmac,wmac,ucorr,vcorr,wcorr,local_938 + 3,
                     pMVar11,pMVar10,0,false,local_938,yfluxes,pMVar44,iVar18,&forcing_term,iVar18,
                     pMVar21,(Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&gbx,pBVar51,
                     geom,(DeviceVector<int> *)&Smfi,dt,uVar46 < 3,redistribution_type_00);
          std::__cxx11::string::~string(local_1210);
          std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                    ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&gbx);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&iconserv_h);
        amrex::PODVector<int,_std::allocator<int>_>::~PODVector
                  ((PODVector<int,_std::allocator<int>_> *)&Smfi);
        lVar30 = lVar30 + 0x18;
      }
      amrex::MultiFab::~MultiFab(&forcing_term);
      amrex::MultiFab::~MultiFab(&momenta);
      amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)&math_bcs);
      if (pMVar21 != (MultiFab *)0x0) {
        (*(pMVar21->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
      }
    }
    else {
      amrex::Abort_host("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }
  }
  if (update_fluxreg && 0 < level) {
    mult = -1.0 / (double)(this->parent->n_cycle).super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[level];
    lVar30 = 0;
    if (num_state_comps < 1) {
      num_state_comps = 0;
    }
    for (; lVar30 != 3; lVar30 = lVar30 + 1) {
      for (iVar18 = 0; num_state_comps != iVar18; iVar18 = iVar18 + 1) {
        amrex::FluxRegister::FineAdd
                  (adv_flux_reg,local_938 + lVar30,(int)lVar30,iVar18,iVar18,1,-dt);
      }
      amrex::FluxRegister::FineAdd
                ((FluxRegister *)
                 (this->mac_reg).
                 super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
                 super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                 ,Ucorr->_M_elems[lVar30],
                 (MultiFab *)
                 ((undefined1 *)
                  ((long)this_00._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x540) +
                 lVar30 * 0x180),(int)lVar30,0,0,1,mult);
    }
  }
  amrex::FillPatchIterator::~FillPatchIterator(&S_fpi);
  amrex::MultiFab::~MultiFab(&visc_terms);
  lVar30 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar30));
    lVar30 = lVar30 + -0x180;
  } while (lVar30 != -0x180);
  lVar30 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar30));
    lVar30 = lVar30 + -0x180;
  } while (lVar30 != -0x180);
  return;
}

Assistant:

void
MacProj::mac_sync_compute (int                   level,
                           Array<MultiFab*,AMREX_SPACEDIM>& Ucorr,
                           MultiFab*             u_mac,
                           MultiFab&             Vsync,
                           MultiFab&             Ssync,
                           FluxRegister*         adv_flux_reg,
                           Vector<AdvectionForm>& advectionType,
                           Real                  prev_time,
                           Real                  dt,
                           int                   num_state_comps,
                           Real                  be_cn_theta,
                           int                   do_mom_diff,
                           bool                  update_fluxreg)
{
    //
    // Get parameters.
    //
    const BoxArray& grids               = LevelData[level]->boxArray();
    const DistributionMapping& dmap     = LevelData[level]->DistributionMap();
    const Geometry& geom                = parent->Geom(level);
    NavierStokesBase&   ns_level        = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab* area                = ns_level.Area();

    // Only two options: do all state components (including velocity) or just the
    // velocity components. Anything else will likely cause problems with the
    // mac register update.
    AMREX_ASSERT(num_state_comps == AMREX_SPACEDIM || num_state_comps == ns_level.NUM_STATE);

    const int  ncomp = 1;         // Number of components to process at once

    const int  nghost  = 0;

    //
    // Prep MFs to store fluxes and edge states
    //
    MultiFab fluxes[AMREX_SPACEDIM];
    MultiFab edgestate[AMREX_SPACEDIM];

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        const BoxArray& ba = LevelData[level]->getEdgeBoxArray(i);
        fluxes[i].define(ba, dmap, num_state_comps, nghost, MFInfo(),ns_level.Factory());
        edgestate[i].define(ba, dmap, ncomp, nghost, MFInfo(), ns_level.Factory());
    }

    // Visc terms, is not used for MOL but we define it here anyways as base for the following
    // FillPatch operator
    MultiFab visc_terms(grids,dmap,num_state_comps,ns_level.nghost_force(),
                        MFInfo(),ns_level.Factory());
    FillPatchIterator S_fpi(ns_level,visc_terms,ns_level.nghost_state(),
                            prev_time,State_Type,0,num_state_comps);
    MultiFab& Smf = S_fpi.get_mf();

    //
    // Compute the mac sync correction.
    //
    if (ns_level.advection_scheme == "MOL")
    {
        Vector<BCRec>  math_bcs(ncomp);

        for (int comp = 0; comp < num_state_comps; ++comp)
        {
            // Get BCs for this component
            math_bcs = ns_level.fetchBCArray(State_Type, comp, ncomp);

            // Select sync MF and its component for processing
            const int  sync_comp = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
            MultiFab*  sync_ptr  = comp < AMREX_SPACEDIM ? &Vsync : &Ssync;
            bool    is_velocity  = comp < AMREX_SPACEDIM ? true   : false;

            BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                               ? ns_level.get_bcrec_velocity_d_ptr()
                                               : ns_level.get_bcrec_scalars_d_ptr();

#ifdef AMREX_USE_EB
            if ( !(ns_level.EBFactory().isAllRegular()) )
            {
                EBMOL::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp, Smf, comp,
                                       D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                       D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                       D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                       D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                       math_bcs, &d_bcrec_ptr[sync_comp], geom, dt,
                                       is_velocity, ns_level.redistribution_type );
            }
            else
#endif
            {
                MOL::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp, Smf, comp,
                                     D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                     D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                     D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                     math_bcs, &d_bcrec_ptr[sync_comp], geom, is_velocity );
            }
        }
    }
    else if ( ns_level.advection_scheme == "Godunov_PLM" ||
              ns_level.advection_scheme == "Godunov_PPM" ||
              ns_level.advection_scheme == "BDS" )
    {
        std::unique_ptr<MultiFab> divu_fp (ns_level.getDivCond(ns_level.nghost_force(),prev_time));

        MultiFab& Gp = ns_level.get_old_data(Gradp_Type);

        visc_terms.setVal(0.0); // Initialize to make calls below safe

        // Get viscous forcing.
        if (be_cn_theta != 1.0)
        {
            ns_level.getViscTerms(visc_terms,0,num_state_comps,prev_time);
        }

        // Get density -- this isn't really needed if doing all of the state components...
        FillPatchIterator rho_fpi(ns_level,visc_terms,ns_level.nghost_state(),
                                  prev_time,State_Type,Density,1);
        MultiFab& rhoMF = rho_fpi.get_mf();

        // FIXME? - not sure we really need this momenta MF; could probably do with a
        // temporary FAB in the sync loop...
        //
        // Store momenta multifab if conservative approach is used,
        // i.e. rho* u.
        // We make it with AMREX_SPACEDIM components instead of only one
        // (loop below is done component by component) because ComputeSyncAofs will
        // need to know which component of velocity is being processed.
        MultiFab momenta;
        if  (do_mom_diff == 1)
        {
            momenta.define(grids,dmap, AMREX_SPACEDIM, Smf.nGrow(), MFInfo(), Smf.Factory());
            MultiFab::Copy(momenta,Smf,0,0,AMREX_SPACEDIM, Smf.nGrow());
            for (int d=0; d < AMREX_SPACEDIM; ++d )
                MultiFab::Multiply( momenta, rhoMF, 0, d, 1, Smf.nGrow());
        }


        //
        // Compute forcing terms
        //
        MultiFab forcing_term(grids, dmap, num_state_comps, ns_level.nghost_force());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter Smfi(Smf,TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
        {
            auto const gbx = Smfi.growntilebox(ns_level.nghost_force());

            //
            // Compute total forcing terms.
            //
            ns_level.getForce(forcing_term[Smfi],gbx,0,num_state_comps,
                              prev_time,Smf[Smfi],rhoMF[Smfi],0,Smfi);

            for (int comp = 0; comp < num_state_comps; ++comp)
            {
                auto const& tf    = forcing_term.array(Smfi,comp);

                if (comp < AMREX_SPACEDIM)  // Velocity/Momenta
                {
                    auto const& visc = visc_terms[Smfi].const_array(comp);
                    auto const& gp   = Gp[Smfi].const_array(comp);

                    if ( do_mom_diff == 0 )
                    {
                        auto const& rho   = rhoMF[Smfi].const_array();

                        amrex::ParallelFor(gbx, [tf, visc, gp, rho]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        {
                            tf(i,j,k)  += visc(i,j,k) - gp(i,j,k);
                            tf(i,j,k)  /= rho(i,j,k);
                        });
                    }
                    else
                    {
                        amrex::ParallelFor(gbx, [tf, visc, gp]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        {
                            tf(i,j,k)  += visc(i,j,k) - gp(i,j,k);
                        });
                    }

                }
                else  // Scalars. Reconstruct forcing terms as in scalar_advection
                {
                    auto const& visc = visc_terms[Smfi].const_array(comp);
                    auto const& rho = rhoMF[Smfi].const_array();

                    if ( NavierStokesBase::do_temp && comp==NavierStokesBase::Temp )
                    {
                        //
                        // Solving
                        //   dT/dt + U dot del T = ( del dot lambda grad T + H_T ) / (rho c_p)
                        // with tforces = H_T/c_p (since it's always density-weighted), and
                        // visc = del dot mu grad T, where mu = lambda/c_p
                        //
                        amrex::ParallelFor(gbx, [tf, visc, rho]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        { tf(i,j,k) = ( tf(i,j,k) + visc(i,j,k) ) / rho(i,j,k); });
                    }
                    else
                    {
                        if (advectionType[comp] == Conservative)
                        {
                            //
                            // For tracers, Solving
                            //   dS/dt + del dot (U S) = del dot beta grad (S/rho) + rho H_q
                            // where S = rho q, q is a concentration
                            // tforces = rho H_q (since it's always density-weighted)
                            // visc = del dot beta grad (S/rho)
                            //
                            amrex::ParallelFor(gbx, [tf, visc]
                            AMREX_GPU_DEVICE (int i, int j, int k ) noexcept
                            { tf(i,j,k) += visc(i,j,k); });
                        }
                        else
                        {
                            //
                            // Solving
                            //   dS/dt + U dot del S = del dot beta grad S + H_q
                            // where S = q, q is a concentration
                            // tforces = rho H_q (since it's always density-weighted)
                            // visc = del dot beta grad S
                            //
                            amrex::ParallelFor(gbx, [tf, visc, rho]
                            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                            { tf(i,j,k) = tf(i,j,k) / rho(i,j,k) + visc(i,j,k); });
                        }
                    }
                }
            }
        }

        //
        // Perform sync
        //
        for (int comp = 0; comp < num_state_comps; ++comp)
        {
            // Select sync MF and its component for processing
            const int  sync_comp   = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
            MultiFab*  sync_ptr    = comp < AMREX_SPACEDIM ? &Vsync : &Ssync;
            const bool is_velocity = comp < AMREX_SPACEDIM ? true   : false;
            BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                               ? &(ns_level.get_bcrec_velocity_d_ptr())[sync_comp]
                                               : &(ns_level.get_bcrec_scalars_d_ptr())[sync_comp];

            const auto& Q = (do_mom_diff == 1 and comp < AMREX_SPACEDIM) ? momenta : Smf;

            amrex::Gpu::DeviceVector<int> iconserv;
            Vector<int> iconserv_h;
            iconserv.resize(ncomp);
            iconserv_h.resize(ncomp, 0);
            for (int icomp = 0; icomp < ncomp; icomp++) {
                iconserv_h[icomp] = (advectionType[comp+icomp] == Conservative) ? 1 : 0;
            }
            Gpu::copy(Gpu::hostToDevice, iconserv_h.begin(), iconserv_h.end(), iconserv.begin());
            bool godunov_use_ppm = ( ns_level.advection_scheme == "Godunov_PPM" ? true : false );

#ifdef AMREX_USE_EB
            if ( !(ns_level.EBFactory().isAllRegular()) )
            {
                // Get BCs for this component
                Vector<BCRec>  math_bcs(ncomp);
                math_bcs = ns_level.fetchBCArray(State_Type, comp, ncomp);

                EBGodunov::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                           Q, comp,
                                           AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                           AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                           AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                           AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                           forcing_term, comp, *divu_fp,
                                           math_bcs, d_bcrec_ptr,
                                           geom, iconserv, dt, is_velocity,
                                           ns_level.redistribution_type);
            }
            else
#endif
            if (ns_level.advection_scheme == "BDS" && (!is_velocity))
            {
                BDS::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                     Q, comp,
                                     AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                     forcing_term, comp, *divu_fp,
                                     d_bcrec_ptr, geom, iconserv, dt, is_velocity);
            }
            else
            {
                Godunov::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                         Q, comp,
                                         AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                         AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                         AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                         AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                         forcing_term, comp, *divu_fp,
                                         d_bcrec_ptr, geom, iconserv, dt,
                                         godunov_use_ppm, ns_level.GodunovUseForcesInTrans(),
                                         is_velocity );
            }
        }
    }
    else
    {
        Abort("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }


    if (level > 0 && update_fluxreg)
    {
        const Real mlt =  -1.0/Real(parent->nCycle(level));
        for (int d = 0; d < AMREX_SPACEDIM; ++d)
        {
            for (int comp = 0; comp < num_state_comps; ++comp)
            {
                    adv_flux_reg->FineAdd(fluxes[d],d,comp,comp,1,-dt);
            }
            //
            // Include grad_phi(aka Ucorr) in the mac registers corresponding
            // to the next coarsest interface.
            //
            mac_reg[level]->FineAdd(*Ucorr[d],area[d],d,0,0,1,mlt);
        }
    }
}